

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkUniquenessAndLinearity
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  ostringstream *poVar1;
  uint uVar2;
  pointer puVar3;
  MessageBuilder *this;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  undefined1 local_1b0 [384];
  
  counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  uVar7 = 0xffffffff;
  uVar10 = 0;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = puVar3[uVar6];
    uVar11 = uVar7;
    if (uVar2 < uVar7) {
      uVar11 = uVar2;
    }
    uVar12 = uVar2;
    if (uVar2 < uVar10) {
      uVar12 = uVar10;
    }
    if (uVar2 != 0xffffffff) {
      uVar10 = uVar12;
      uVar7 = uVar11;
    }
  }
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&counts,(ulong)((uVar10 - uVar7) + 1),(value_type_conflict4 *)local_1b0);
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar10 = puVar3[uVar6];
    if (uVar10 != 0xffffffff) {
      counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 - uVar7] =
           counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 - uVar7] + 1;
    }
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  lVar13 = 0;
  iVar9 = 0;
  for (lVar8 = 0;
      lVar8 < (int)((ulong)((long)counts.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)counts.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); lVar8 = lVar8 + 1)
  {
    if (*(int *)((long)counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar13) != 1) {
      if (iVar9 < 0x14) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Value ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," is not unique. Returned ");
        this = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (uint *)((long)counts.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar13));
        std::operator<<(&(this->m_str).super_basic_ostream<char,_std::char_traits<char>_>," times.")
        ;
        tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      iVar9 = iVar9 + 1;
    }
    lVar13 = lVar13 + 4;
  }
  if (0x14 < iVar9) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Number of values not unique: ");
    std::ostream::operator<<(poVar1,iVar9);
    std::operator<<((ostream *)poVar1,", displaying first 20 values.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return iVar9 == 0;
}

Assistant:

bool AtomicCounterTest::checkUniquenessAndLinearity (TestLog& log, const vector<deUint32>& values)
{
	vector<deUint32>	counts;
	int					failedCount	= 0;
	deUint32			minValue	= (deUint32)-1;
	deUint32			maxValue	= 0;

	DE_ASSERT(!values.empty());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			minValue = std::min(minValue, values[valueNdx]);
			maxValue = std::max(maxValue, values[valueNdx]);
		}
	}

	counts.resize(maxValue - minValue + 1, 0);

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
			counts[values[valueNdx] - minValue]++;
	}

	for (int countNdx = 0; countNdx < (int)counts.size(); countNdx++)
	{
		if (counts[countNdx] != 1)
		{
			if (failedCount < 20)
				log << TestLog::Message << "Value " << (minValue + countNdx) << " is not unique. Returned " << counts[countNdx] << " times." << TestLog::EndMessage;

			failedCount++;
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not unique: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}